

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

BOOL __thiscall
Memory::Recycler::CollectWithExhaustiveCandidate<(Memory::CollectionFlags)268480512>(Recycler *this)

{
  BOOL BVar1;
  Recycler *this_local;
  
  this->hasExhaustiveCandidate = true;
  BVar1 = CollectInternal<(Memory::CollectionFlags)268480512>(this);
  return BVar1;
}

Assistant:

BOOL
Recycler::CollectWithExhaustiveCandidate()
{
    Assert(flags & CollectOverride_ExhaustiveCandidate);

    // Currently we don't have any exhaustive candidate that has heuristic.
    Assert((flags & CollectHeuristic_Mask & ~CollectHeuristic_Never) == 0);

    this->hasExhaustiveCandidate = true;

    if (flags & CollectHeuristic_Never)
    {
        // This is just an exhaustive candidate notification. Don't trigger a GC.
        return false;
    }

    // Continue with the GC heuristic
    return CollectInternal<flags>();
 }